

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O1

void __thiscall TasGrid::GridGlobal::proposeUpdatedTensors(GridGlobal *this)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  int max_level;
  MultiIndexSet local_120;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  OneDimensionalWrapper local_d8;
  
  piVar1 = (this->updated_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->updated_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar4 = piVar1;
  if (piVar1 == piVar2) {
    max_level = 0;
  }
  else {
    while (piVar3 = piVar4, piVar1 = piVar1 + 1, piVar1 != piVar2) {
      piVar4 = piVar1;
      if (*piVar1 <= *piVar3) {
        piVar4 = piVar3;
      }
    }
    max_level = *piVar3;
  }
  OneDimensionalWrapper::OneDimensionalWrapper
            (&local_d8,&this->custom,max_level,this->rule,this->alpha,this->beta);
  (this->wrapper).rule = local_d8.rule;
  (this->wrapper).isNonNested = local_d8.isNonNested;
  *(undefined3 *)&(this->wrapper).field_0x1 = local_d8._1_3_;
  (this->wrapper).num_levels = local_d8.num_levels;
  ::std::vector<int,_std::allocator<int>_>::operator=
            (&(this->wrapper).num_points,&local_d8.num_points);
  ::std::vector<int,_std::allocator<int>_>::operator=(&(this->wrapper).pntr,&local_d8.pntr);
  ::std::vector<int,_std::allocator<int>_>::operator=(&(this->wrapper).indx,&local_d8.indx);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&(this->wrapper).weights,&local_d8.weights);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&(this->wrapper).nodes,&local_d8.nodes);
  ::std::vector<double,_std::allocator<double>_>::operator=
            (&(this->wrapper).unique,&local_d8.unique);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&(this->wrapper).coeff,&local_d8.coeff);
  OneDimensionalWrapper::~OneDimensionalWrapper(&local_d8);
  MultiIndexManipulations::computeActiveTensorsWeights
            (&this->updated_tensors,&this->updated_active_tensors,&this->updated_active_w);
  bVar5 = OneDimensionalMeta::isNonNested(this->rule);
  if (bVar5) {
    MultiIndexManipulations::generateNonNestedPoints
              (&local_120,&this->updated_active_tensors,&this->wrapper);
  }
  else {
    local_f8._8_8_ = 0;
    pcStack_e0 = ::std::
                 _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:193:80)>
                 ::_M_invoke;
    local_e8 = ::std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:193:80)>
               ::_M_manager;
    local_f8._M_unused._M_object = this;
    MultiIndexManipulations::generateNestedPoints
              (&local_120,&this->updated_tensors,(function<int_(int)> *)&local_f8);
  }
  MultiIndexSet::operator-
            ((MultiIndexSet *)&local_d8,&local_120,&(this->super_BaseCanonicalGrid).points);
  (this->super_BaseCanonicalGrid).needed.cache_num_indexes = local_d8.rule;
  (this->super_BaseCanonicalGrid).needed.num_dimensions = local_d8._0_8_;
  ::std::vector<int,_std::allocator<int>_>::operator=
            (&(this->super_BaseCanonicalGrid).needed.indexes,&local_d8.num_points);
  if (local_d8.num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_120.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((!bVar5) && (local_e8 != (code *)0x0)) {
    (*local_e8)((_Any_data *)&local_f8,(_Any_data *)&local_f8,__destroy_functor);
  }
  return;
}

Assistant:

void GridGlobal::proposeUpdatedTensors(){
    wrapper = OneDimensionalWrapper(custom, updated_tensors.getMaxIndex(), rule, alpha, beta);

    MultiIndexManipulations::computeActiveTensorsWeights(updated_tensors, updated_active_tensors, updated_active_w);

    // the new needed points are the points associated with the updated_active_tensors without the existing set of loaded points
    needed = ((OneDimensionalMeta::isNonNested(rule)) ?
                MultiIndexManipulations::generateNonNestedPoints(updated_active_tensors, wrapper) :
                MultiIndexManipulations::generateNestedPoints(updated_tensors, [&](int l) -> int{ return wrapper.getNumPoints(l); }))
             - points;
}